

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O0

int bit_result64(lua_State *L,CTypeID id,uint64_t x)

{
  long lVar1;
  void *pvVar2;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  GCcdata *cd;
  GCcdata *cd_1;
  undefined4 in_stack_ffffffffffffff70;
  
  pvVar2 = lj_mem_newgco((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffff70),
                         (GCSize)((ulong)in_RDX >> 0x20));
  *(undefined1 *)((long)pvVar2 + 5) = 10;
  *(short *)((long)pvVar2 + 6) = (short)in_ESI;
  *(long *)((ulong)*(uint *)(in_RDI + 8) + 0xe0) =
       *(long *)((ulong)*(uint *)(in_RDI + 8) + 0xe0) + 1;
  *(undefined8 *)((long)pvVar2 + 8) = in_RDX;
  lVar1 = *(long *)(in_RDI + 0x10);
  *(int *)(lVar1 + -8) = (int)pvVar2;
  *(undefined4 *)(lVar1 + -4) = 0xfffffff5;
  return 2;
}

Assistant:

static int bit_result64(lua_State *L, CTypeID id, uint64_t x)
{
  GCcdata *cd = lj_cdata_new_(L, id, 8);
  *(uint64_t *)cdataptr(cd) = x;
  setcdataV(L, L->base-1-LJ_FR2, cd);
  return FFH_RES(1);
}